

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O3

blob_t blobCopy(blob_t dest,blob_t src)

{
  size_t size;
  
  if (dest != src) {
    if (src == (blob_t)0x0) {
      size = 0;
    }
    else {
      size = *(size_t *)((long)src + -8);
    }
    dest = blobResize(dest,size);
    if (dest == (blob_t)0x0) {
      dest = (blob_t)0x0;
    }
    else {
      memCopy(dest,src,size);
    }
  }
  return dest;
}

Assistant:

blob_t blobCopy(blob_t dest, const blob_t src)
{
	size_t size;
	ASSERT(blobIsValid(dest) && blobIsValid(src));
	if (dest == src)
		return dest;
	size = blobSize(src);
	dest = blobResize(dest, size);
	if (dest)
		memCopy(dest, src, size);
	return dest;
}